

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_util.c
# Opt level: O1

char * SampleUtil_GetFirstDocumentItem(IXML_Document *doc,char *item)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  lVar1 = ixmlDocument_getElementsByTagName();
  if (lVar1 == 0) {
    pcVar3 = (char *)0x0;
    SampleUtil_Print("%s(%d): Error finding %s in XML Node\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/upnp/sample/common/sample_util.c"
                     ,0xf3,item);
  }
  else {
    lVar2 = ixmlNodeList_item(lVar1,0);
    if (lVar2 == 0) {
      pcVar3 = (char *)0x0;
      SampleUtil_Print("%s(%d): ixmlNodeList_item(nodeList, 0) returned NULL\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/upnp/sample/common/sample_util.c"
                       ,0xef);
    }
    else {
      lVar2 = ixmlNode_getFirstChild(lVar2);
      if (lVar2 == 0) {
        pcVar3 = "%s(%d): (BUG) ixmlNode_getFirstChild(tmpNode) returned NULL\n";
        uVar4 = 0xd5;
      }
      else {
        pcVar3 = (char *)ixmlNode_getNodeValue(lVar2);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "%s(%d): ixmlNode_getNodeValue returned NULL\n";
          uVar4 = 0xdf;
        }
        else {
          pcVar3 = strdup(pcVar3);
          if (pcVar3 != (char *)0x0) goto LAB_0010398b;
          pcVar3 = "%s(%d): Error allocating memory for XML Node value\n";
          uVar4 = 0xe8;
        }
      }
      SampleUtil_Print(pcVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/upnp/sample/common/sample_util.c"
                       ,uVar4);
      pcVar3 = strdup("");
    }
  }
LAB_0010398b:
  if (lVar1 != 0) {
    ixmlNodeList_free(lVar1);
  }
  return pcVar3;
}

Assistant:

char *SampleUtil_GetFirstDocumentItem(IXML_Document *doc, const char *item)
{
	IXML_NodeList *nodeList = NULL;
	IXML_Node *textNode = NULL;
	IXML_Node *tmpNode = NULL;
	const char *nodeValue = NULL;
	char *ret = NULL;

	nodeList = ixmlDocument_getElementsByTagName(doc, (char *)item);
	if (nodeList) {
		tmpNode = ixmlNodeList_item(nodeList, 0);
		if (tmpNode) {
			textNode = ixmlNode_getFirstChild(tmpNode);
			if (!textNode) {
				SampleUtil_Print("%s(%d): (BUG) "
						 "ixmlNode_getFirstChild("
						 "tmpNode) returned NULL\n",
					__FILE__,
					__LINE__);
				ret = strdup("");
				goto epilogue;
			}
			nodeValue = ixmlNode_getNodeValue(textNode);
			if (!nodeValue) {
				SampleUtil_Print(
					"%s(%d): ixmlNode_getNodeValue "
					"returned NULL\n",
					__FILE__,
					__LINE__);
				ret = strdup("");
				goto epilogue;
			}
			ret = strdup(nodeValue);
			if (!ret) {
				SampleUtil_Print("%s(%d): Error allocating "
						 "memory for XML Node value\n",
					__FILE__,
					__LINE__);
				ret = strdup("");
			}
		} else
			SampleUtil_Print("%s(%d): ixmlNodeList_item(nodeList, "
					 "0) returned NULL\n",
				__FILE__,
				__LINE__);
	} else
		SampleUtil_Print("%s(%d): Error finding %s in XML Node\n",
			__FILE__,
			__LINE__,
			item);

epilogue:
	if (nodeList)
		ixmlNodeList_free(nodeList);

	return ret;
}